

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

size_t __thiscall libchars::command_cursor::current_length(command_cursor *this)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  const_reference ppcVar5;
  size_t sVar6;
  command_node *n;
  command_cursor *this_local;
  
  bVar2 = std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::empty(&this->S);
  if (bVar2) {
    if ((this->root != (command_node *)0x0) &&
       (uVar1 = this->root_idx, uVar3 = std::__cxx11::string::length(), uVar1 < uVar3)) {
      lVar4 = std::__cxx11::string::length();
      return lVar4 - this->root_idx;
    }
  }
  else {
    ppcVar5 = std::
              stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              ::top(&this->S);
    if (*ppcVar5 != (value_type)0x0) {
      sVar6 = std::__cxx11::string::length();
      return sVar6;
    }
  }
  return 0;
}

Assistant:

size_t command_cursor::current_length() const
    {
        if (S.empty()) {
            if (root != NULL && root_idx < root->part.length())
                return (root->part.length() - root_idx);
        }
        else {
            command_node *n = S.top();
            if (n != NULL)
                return n->part.length();
        }
        return 0;
    }